

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.cpp
# Opt level: O1

AggregateFunction *
duckdb::GetAverageAggregate(AggregateFunction *__return_storage_ptr__,PhysicalType type)

{
  InternalException *this;
  int iVar1;
  undefined7 in_register_00000031;
  LogicalType *this_00;
  FunctionNullHandling in_R8B;
  undefined1 local_b8 [56];
  LogicalType local_80;
  LogicalType local_68;
  LogicalType local_50;
  LogicalType local_38;
  
  iVar1 = (int)CONCAT71(in_register_00000031,type);
  if (iVar1 < 9) {
    if (iVar1 == 5) {
      LogicalType::LogicalType((LogicalType *)local_b8,SMALLINT);
      LogicalType::LogicalType(&local_38,DOUBLE);
      AggregateFunction::
      UnaryAggregate<duckdb::AvgState<long>,short,double,duckdb::IntegerAverageOperation,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,(AggregateFunction *)local_b8,&local_38,(LogicalType *)0x0,
                 in_R8B);
      this_00 = &local_38;
    }
    else {
      if (iVar1 != 7) {
LAB_01943702:
        this = (InternalException *)__cxa_allocate_exception(0x10);
        local_b8._0_8_ = local_b8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b8,"Unimplemented average aggregate","");
        InternalException::InternalException(this,(string *)local_b8);
        __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      LogicalType::LogicalType((LogicalType *)local_b8,INTEGER);
      LogicalType::LogicalType(&local_50,DOUBLE);
      AggregateFunction::
      UnaryAggregate<duckdb::AvgState<duckdb::hugeint_t>,int,double,duckdb::IntegerAverageOperationHugeint,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,(AggregateFunction *)local_b8,&local_50,(LogicalType *)0x0,
                 in_R8B);
      this_00 = &local_50;
    }
  }
  else if (iVar1 == 9) {
    LogicalType::LogicalType((LogicalType *)local_b8,BIGINT);
    LogicalType::LogicalType(&local_68,DOUBLE);
    AggregateFunction::
    UnaryAggregate<duckdb::AvgState<duckdb::hugeint_t>,long,double,duckdb::IntegerAverageOperationHugeint,(duckdb::AggregateDestructorType)0>
              (__return_storage_ptr__,(AggregateFunction *)local_b8,&local_68,(LogicalType *)0x0,
               in_R8B);
    this_00 = &local_68;
  }
  else if (iVar1 == 0x15) {
    LogicalType::LogicalType((LogicalType *)local_b8,INTERVAL);
    LogicalType::LogicalType((LogicalType *)(local_b8 + 0x20),INTERVAL);
    AggregateFunction::
    UnaryAggregate<duckdb::IntervalAvgState,duckdb::interval_t,duckdb::interval_t,duckdb::IntervalAverageOperation,(duckdb::AggregateDestructorType)0>
              (__return_storage_ptr__,(AggregateFunction *)local_b8,(LogicalType *)(local_b8 + 0x20)
               ,(LogicalType *)0x0,in_R8B);
    this_00 = (LogicalType *)(local_b8 + 0x20);
  }
  else {
    if (iVar1 != 0xcc) goto LAB_01943702;
    LogicalType::LogicalType((LogicalType *)local_b8,HUGEINT);
    LogicalType::LogicalType(&local_80,DOUBLE);
    AggregateFunction::
    UnaryAggregate<duckdb::AvgState<duckdb::hugeint_t>,duckdb::hugeint_t,double,duckdb::HugeintAverageOperation,(duckdb::AggregateDestructorType)0>
              (__return_storage_ptr__,(AggregateFunction *)local_b8,&local_80,(LogicalType *)0x0,
               in_R8B);
    this_00 = &local_80;
  }
  LogicalType::~LogicalType(this_00);
  LogicalType::~LogicalType((LogicalType *)local_b8);
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetAverageAggregate(PhysicalType type) {
	switch (type) {
	case PhysicalType::INT16: {
		return AggregateFunction::UnaryAggregate<AvgState<int64_t>, int16_t, double, IntegerAverageOperation>(
		    LogicalType::SMALLINT, LogicalType::DOUBLE);
	}
	case PhysicalType::INT32: {
		return AggregateFunction::UnaryAggregate<AvgState<hugeint_t>, int32_t, double, IntegerAverageOperationHugeint>(
		    LogicalType::INTEGER, LogicalType::DOUBLE);
	}
	case PhysicalType::INT64: {
		return AggregateFunction::UnaryAggregate<AvgState<hugeint_t>, int64_t, double, IntegerAverageOperationHugeint>(
		    LogicalType::BIGINT, LogicalType::DOUBLE);
	}
	case PhysicalType::INT128: {
		return AggregateFunction::UnaryAggregate<AvgState<hugeint_t>, hugeint_t, double, HugeintAverageOperation>(
		    LogicalType::HUGEINT, LogicalType::DOUBLE);
	}
	case PhysicalType::INTERVAL: {
		return AggregateFunction::UnaryAggregate<IntervalAvgState, interval_t, interval_t, IntervalAverageOperation>(
		    LogicalType::INTERVAL, LogicalType::INTERVAL);
	}
	default:
		throw InternalException("Unimplemented average aggregate");
	}
}